

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O1

CodeGenRecyclableData * __thiscall
NativeCodeGenerator::GatherCodeGenData
          (NativeCodeGenerator *this,FunctionBody *topFunctionBody,FunctionBody *functionBody,
          EntryPointInfo *entryPoint,CodeGenWorkItem *workItem,void *function)

{
  size_t size;
  ThreadContextId pvVar1;
  ScriptContextProfiler *profiler;
  Utf8SourceInfo *pUVar2;
  PolymorphicInlineCacheInfoIDL *selfInfo;
  code *pcVar3;
  AutoProfile AVar4;
  bool bVar5;
  ObjTypeSpecFldInfoFlags OVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  BOOL BVar10;
  ThreadContextId pvVar11;
  undefined4 *puVar12;
  FunctionCodeGenJitTimeData *jitTimeData;
  TempArenaAllocatorObject *tempAllocator;
  undefined4 extraout_var;
  char16 *pcVar13;
  undefined4 extraout_var_00;
  char16 *pcVar14;
  JavascriptFunction *function_00;
  NativeEntryPointData *pNVar15;
  PropertyId *pPVar16;
  FieldAccessStats *pFVar17;
  ScriptContext *this_00;
  undefined4 extraout_var_01;
  Recycler *this_01;
  Type *array;
  Type *ppOVar18;
  EntryPointPolymorphicInlineCacheInfo *runtimeInfo;
  Recycler *pRVar19;
  CodeGenRecyclableData *this_02;
  uint count;
  Type *addr;
  wchar local_1a8 [4];
  char16 debugStringBuffer2 [42];
  wchar local_148 [4];
  char16 debugStringBuffer [42];
  undefined1 local_e8 [8];
  InliningDecider inliningDecider;
  undefined **local_90;
  Type stats;
  AutoProfile local_68;
  AutoProfile autoProfile;
  
  pvVar1 = this->mainThreadId;
  inliningDecider._64_8_ = function;
  pvVar11 = JsUtil::ExternalApi::GetCurrentThreadContextId();
  if (pvVar1 != pvVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0xc2c,"(mainThreadId == GetCurrentThreadContextId())",
                       "Cannot use this member of native code generator from thread other than the creating context\'s current thread"
                      );
    if (!bVar5) goto LAB_006023e4;
    *puVar12 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0xc2d,"(functionBody)","functionBody");
    if (!bVar5) goto LAB_006023e4;
    *puVar12 = 0;
  }
  profiler = this->foregroundCodeGenProfiler;
  local_68.codeGenProfiler = profiler;
  ProfileBegin(profiler,DelayPhase);
  ProfileBegin(profiler,GatherCodeGenDataPhase);
  pRVar19 = this->scriptContext->recycler;
  jitTimeData = Js::FunctionCodeGenJitTimeData::New
                          (pRVar19,(functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                                   functionInfo.ptr,entryPoint,true);
  pUVar2 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  if (((pUVar2->debugModeSource).ptr == (uchar *)0x0) && ((pUVar2->field_0xa8 & 0x20) == 0)) {
    bVar5 = false;
  }
  else {
    bVar5 = (bool)((pUVar2->field_0xa8 & 0x40) >> 6);
  }
  InliningDecider::InliningDecider
            ((InliningDecider *)local_e8,functionBody,(workItem->jitData).type == '\x01',bVar5,
             (workItem->jitData).jitMode);
  tempAllocator = Js::ScriptContext::GetTemporaryAllocator(this->scriptContext,L"GatherCodeGenData")
  ;
  autoProfile.codeGenProfiler =
       (ScriptContextProfiler *)
       new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)&tempAllocator->allocator,0x3f1274);
  *(undefined4 *)&(autoProfile.codeGenProfiler)->backgroundRecyclerProfilerArena = 0;
  (autoProfile.codeGenProfiler)->profilerArena = (ArenaAllocator *)autoProfile.codeGenProfiler;
  (autoProfile.codeGenProfiler)->profiler = (Profiler *)&tempAllocator->allocator;
  uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
  if ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_006023e4;
    *puVar12 = 0;
  }
  bVar5 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015cd718,ObjTypeSpecPhase,uVar7,
                     ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                      functionInfo.ptr)->functionId);
  if (bVar5) {
LAB_00601dd0:
    iVar8 = (*(topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                      (topFunctionBody);
    pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)topFunctionBody,(wchar (*) [42])local_148);
    iVar9 = (*(functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                      (functionBody);
    pcVar14 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)functionBody,(wchar (*) [42])local_1a8);
    Output::Print(L"ObjTypeSpec: top function %s (%s), function %s (%s): GatherCodeGenData(): \n",
                  CONCAT44(extraout_var,iVar8),pcVar13,CONCAT44(extraout_var_00,iVar9),pcVar14);
  }
  else {
    uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
    if ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) goto LAB_006023e4;
      *puVar12 = 0;
    }
    bVar5 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015cd718,EquivObjTypeSpecPhase,uVar7,
                       ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                        functionInfo.ptr)->functionId);
    if (bVar5) goto LAB_00601dd0;
  }
  if (inliningDecider._64_8_ == 0) {
    function_00 = (JavascriptFunction *)0x0;
  }
  else {
    function_00 = Js::VarTo<Js::JavascriptFunction>((Var)inliningDecider._64_8_);
  }
  GatherCodeGenData<false>
            (this,pRVar19,topFunctionBody,functionBody,entryPoint,(InliningDecider *)local_e8,
             (ObjTypeSpecFldInfoList *)autoProfile.codeGenProfiler,jitTimeData,
             (FunctionCodeGenRuntimeData *)0x0,function_00,false,0);
  pNVar15 = Js::EntryPointInfo::GetNativeEntryPointData(entryPoint);
  pPVar16 = NativeEntryPointData::GetSharedPropertyGuards
                      (pNVar15,pRVar19,&jitTimeData->sharedPropertyGuardCount);
  addr = &jitTimeData->sharedPropertyGuards;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pPVar16;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  pFVar17 = Js::EntryPointInfo::EnsureFieldAccessStats(entryPoint,pRVar19);
  AVar4 = autoProfile;
  Js::FieldAccessStats::Add(pFVar17,(jitTimeData->inlineCacheStats).ptr);
  this_00 = Js::EntryPointInfo::GetScriptContext(entryPoint);
  Js::ScriptContext::RecordFieldAccessStats(this_00,topFunctionBody,pFVar17);
  uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
  if ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_006023e4;
    *puVar12 = 0;
  }
  bVar5 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015cd718,ObjTypeSpecPhase,uVar7,
                     ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                      functionInfo.ptr)->functionId);
  if (bVar5) {
LAB_00602003:
    pFVar17 = (jitTimeData->inlineCacheStats).ptr;
    Memory::Recycler::WBSetBit((char *)&stack0xffffffffffffff70);
    local_90 = (undefined **)pFVar17;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&stack0xffffffffffffff70);
    iVar8 = (*(topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                      (topFunctionBody);
    pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)topFunctionBody,(wchar (*) [42])local_148);
    Output::Print(L"ObjTypeSpec: gathered code gen data for function %s (%s): inline cache stats:\n"
                  ,CONCAT44(extraout_var_01,iVar8),pcVar13);
    Output::Print(L"    overall: total %u, no profile info %u\n",
                  (ulong)((FieldAccessStats *)local_90)->totalInlineCacheCount,
                  (ulong)((FieldAccessStats *)local_90)->noInfoInlineCacheCount);
    Output::Print(L"    mono: total %u, empty %u, cloned %u\n",
                  (ulong)((FieldAccessStats *)local_90)->monoInlineCacheCount,
                  (ulong)((FieldAccessStats *)local_90)->emptyMonoInlineCacheCount,
                  (ulong)((FieldAccessStats *)local_90)->clonedMonoInlineCacheCount);
    Output::Print(L"    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"
                  ,(ulong)((FieldAccessStats *)local_90)->polyInlineCacheCount,
                  (ulong)((FieldAccessStats *)local_90)->highUtilPolyInlineCacheCount,
                  (ulong)((FieldAccessStats *)local_90)->lowUtilPolyInlineCacheCount,
                  (ulong)((FieldAccessStats *)local_90)->nullPolyInlineCacheCount,
                  (ulong)((FieldAccessStats *)local_90)->emptyPolyInlineCacheCount,
                  (ulong)((FieldAccessStats *)local_90)->ignoredPolyInlineCacheCount,
                  (ulong)((FieldAccessStats *)local_90)->disabledPolyInlineCacheCount,
                  (ulong)((FieldAccessStats *)local_90)->equivPolyInlineCacheCount,
                  (ulong)((FieldAccessStats *)local_90)->nonEquivPolyInlineCacheCount,
                  (ulong)((FieldAccessStats *)local_90)->clonedPolyInlineCacheCount);
  }
  else {
    uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
    if ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) goto LAB_006023e4;
      *puVar12 = 0;
    }
    bVar5 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015cd718,EquivObjTypeSpecPhase,uVar7,
                       ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                        functionInfo.ptr)->functionId);
    if (bVar5) goto LAB_00602003;
  }
  count = *(uint *)&(AVar4.codeGenProfiler)->backgroundRecyclerProfilerArena;
  local_90 = &Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>::typeinfo;
  stats.ptr = (FieldAccessStats *)0x0;
  this_01 = Memory::Recycler::TrackAllocInfo(pRVar19,(TrackAllocData *)&stack0xffffffffffffff70);
  if ((ulong)count == 0) {
    array = (Type *)&DAT_00000008;
    Memory::Recycler::ClearTrackAllocInfo(this_01,(TrackAllocData *)0x0);
  }
  else {
    BVar10 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar10 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar5) goto LAB_006023e4;
      *puVar12 = 0;
    }
    size = (ulong)count * 8;
    array = (Type *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                              (this_01,size);
    if (array == (Type *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar5) {
LAB_006023e4:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar12 = 0;
    }
    memset(array,0,size);
  }
  Js::FunctionCodeGenJitTimeData::SetGlobalObjTypeSpecFldInfoArray(jitTimeData,array,count);
  local_90 = (undefined **)autoProfile.codeGenProfiler;
  stats.ptr = (FieldAccessStats *)autoProfile.codeGenProfiler;
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    count = count - 1;
    if (stats.ptr == (FieldAccessStats *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) goto LAB_006023e4;
      *puVar12 = 0;
    }
    stats.ptr = *stats.ptr;
    if (stats.ptr == (FieldAccessStats *)local_90) {
      stats.ptr = (FieldAccessStats *)0x0;
      Js::ScriptContext::ReleaseTemporaryAllocator(this->scriptContext,tempAllocator);
      pNVar15 = Js::EntryPointInfo::GetNativeEntryPointData(entryPoint);
      runtimeInfo = NativeEntryPointData::EnsurePolymorphicInlineCacheInfo
                              (pNVar15,pRVar19,workItem->functionBody);
      JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo
                (pRVar19,runtimeInfo,&workItem->jitData);
      selfInfo = (workItem->jitData).selfInfo;
      Js::FunctionCodeGenJitTimeData::SetPolymorphicInlineInfo
                (jitTimeData,(workItem->jitData).inlineeInfo,selfInfo,
                 (selfInfo->polymorphicInlineCaches).ptr);
      local_90 = &Js::CodeGenRecyclableData::typeinfo;
      stats.ptr = (FieldAccessStats *)0x0;
      pRVar19 = Memory::Recycler::TrackAllocInfo(pRVar19,(TrackAllocData *)&stack0xffffffffffffff70)
      ;
      this_02 = (CodeGenRecyclableData *)new<Memory::Recycler>(0x18,pRVar19,0x38bbb2);
      Js::CodeGenRecyclableData::CodeGenRecyclableData(this_02,jitTimeData);
      InliningDecider::~InliningDecider((InliningDecider *)local_e8);
      GatherCodeGenData::AutoProfile::~AutoProfile(&local_68);
      return this_02;
    }
    ppOVar18 = SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)&stack0xffffffffffffff70);
    OVar6 = ObjTypeSpecFldInfo::GetFlags(*ppOVar18);
    if ((((ushort)OVar6 >> 9 & 1) == 0) &&
       ((bVar5 = ObjTypeSpecFldInfo::IsPoly(*ppOVar18), !bVar5 ||
        (bVar5 = ObjTypeSpecFldInfo::DoesntHaveEquivalence(*ppOVar18), !bVar5)))) {
      ObjTypeSpecFldInfo::SetFieldValue(*ppOVar18,(Var)0x0);
    }
    Js::FunctionCodeGenJitTimeData::SetGlobalObjTypeSpecFldInfo(jitTimeData,count,*ppOVar18);
  } while( true );
}

Assistant:

Js::CodeGenRecyclableData *
NativeCodeGenerator::GatherCodeGenData(Js::FunctionBody *const topFunctionBody, Js::FunctionBody *const functionBody, Js::EntryPointInfo *const entryPoint, CodeGenWorkItem* workItem, void* function)
{
    ASSERT_THREAD();
    Assert(functionBody);

#ifdef PROFILE_EXEC
    class AutoProfile
    {
    private:
        Js::ScriptContextProfiler *const codeGenProfiler;

    public:
        AutoProfile(Js::ScriptContextProfiler *const codeGenProfiler) : codeGenProfiler(codeGenProfiler)
        {
            ProfileBegin(codeGenProfiler, Js::DelayPhase);
            ProfileBegin(codeGenProfiler, Js::GatherCodeGenDataPhase);
        }

        ~AutoProfile()
        {
            ProfileEnd(codeGenProfiler, Js::GatherCodeGenDataPhase);
            ProfileEnd(codeGenProfiler, Js::DelayPhase);
        }
    } autoProfile(foregroundCodeGenProfiler);
#endif

    UpdateJITState();

    const auto recycler = scriptContext->GetRecycler();
    {
        const auto jitTimeData = Js::FunctionCodeGenJitTimeData::New(recycler, functionBody->GetFunctionInfo(), entryPoint);
        InliningDecider inliningDecider(functionBody, workItem->Type() == JsLoopBodyWorkItemType, functionBody->IsInDebugMode(), workItem->GetJitMode());

        BEGIN_TEMP_ALLOCATOR(gatherCodeGenDataAllocator, scriptContext, _u("GatherCodeGenData"));

        ObjTypeSpecFldInfoList* objTypeSpecFldInfoList = JitAnew(gatherCodeGenDataAllocator, ObjTypeSpecFldInfoList, gatherCodeGenDataAllocator);

#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
        {
            Output::Print(_u("ObjTypeSpec: top function %s (%s), function %s (%s): GatherCodeGenData(): \n"),
                topFunctionBody->GetDisplayName(), topFunctionBody->GetDebugNumberSet(debugStringBuffer), functionBody->GetDisplayName(), functionBody->GetDebugNumberSet(debugStringBuffer2));
        }
#endif
        GatherCodeGenData<false>(recycler, topFunctionBody, functionBody, entryPoint, inliningDecider, objTypeSpecFldInfoList, jitTimeData, nullptr, function ? Js::VarTo<Js::JavascriptFunction>(function) : nullptr, 0);

        jitTimeData->sharedPropertyGuards = entryPoint->GetNativeEntryPointData()->GetSharedPropertyGuards(recycler, jitTimeData->sharedPropertyGuardCount);

#ifdef FIELD_ACCESS_STATS
        Js::FieldAccessStats* fieldAccessStats = entryPoint->EnsureFieldAccessStats(recycler);
        fieldAccessStats->Add(jitTimeData->inlineCacheStats);
        entryPoint->GetScriptContext()->RecordFieldAccessStats(topFunctionBody, fieldAccessStats);
#endif

#ifdef FIELD_ACCESS_STATS
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
        {
            auto stats = jitTimeData->inlineCacheStats;
            Output::Print(_u("ObjTypeSpec: gathered code gen data for function %s (%s): inline cache stats:\n"), topFunctionBody->GetDisplayName(), topFunctionBody->GetDebugNumberSet(debugStringBuffer));
            Output::Print(_u("    overall: total %u, no profile info %u\n"), stats->totalInlineCacheCount, stats->noInfoInlineCacheCount);
            Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
                stats->monoInlineCacheCount, stats->emptyMonoInlineCacheCount, stats->clonedMonoInlineCacheCount);
            Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
                stats->polyInlineCacheCount, stats->highUtilPolyInlineCacheCount, stats->lowUtilPolyInlineCacheCount,
                stats->nullPolyInlineCacheCount, stats->emptyPolyInlineCacheCount, stats->ignoredPolyInlineCacheCount, stats->disabledPolyInlineCacheCount,
                stats->equivPolyInlineCacheCount, stats->nonEquivPolyInlineCacheCount, stats->clonedPolyInlineCacheCount);
        }
#endif

        uint objTypeSpecFldInfoCount = objTypeSpecFldInfoList->Count();
        jitTimeData->SetGlobalObjTypeSpecFldInfoArray(RecyclerNewArray(recycler, Field(ObjTypeSpecFldInfo*), objTypeSpecFldInfoCount), objTypeSpecFldInfoCount);
        uint propertyInfoId = objTypeSpecFldInfoCount - 1;
        FOREACH_SLISTCOUNTED_ENTRY(ObjTypeSpecFldInfo*, info, objTypeSpecFldInfoList)
        {
            // Clear field values we don't need so we don't unnecessarily pin them while JIT-ing.
            if (!info->GetKeepFieldValue() && !(info->IsPoly() && info->DoesntHaveEquivalence()))
            {
                info->SetFieldValue(nullptr);
            }
            jitTimeData->SetGlobalObjTypeSpecFldInfo(propertyInfoId--, info);
        }
        NEXT_SLISTCOUNTED_ENTRY;

        END_TEMP_ALLOCATOR(gatherCodeGenDataAllocator, scriptContext);


        auto jitData = workItem->GetJITData();

        JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo(
            recycler,
            entryPoint->GetNativeEntryPointData()->EnsurePolymorphicInlineCacheInfo(recycler, workItem->GetFunctionBody()),
            jitData);

        jitTimeData->SetPolymorphicInlineInfo(jitData->inlineeInfo, jitData->selfInfo, jitData->selfInfo->polymorphicInlineCaches);

        return RecyclerNew(recycler, Js::CodeGenRecyclableData, jitTimeData);
    }
}